

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

int Gia_ObjTerSimGet0Fanin0(Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  undefined1 local_12;
  undefined1 local_11;
  Gia_Obj_t *pObj_local;
  
  pGVar2 = Gia_ObjFanin0(pObj);
  iVar1 = Gia_ObjTerSimGet1(pGVar2);
  if (iVar1 != 0) {
    iVar1 = Gia_ObjFaninC0(pObj);
    local_11 = 1;
    if (iVar1 != 0) goto LAB_007a9dee;
  }
  pGVar2 = Gia_ObjFanin0(pObj);
  iVar1 = Gia_ObjTerSimGet0(pGVar2);
  local_12 = 0;
  if (iVar1 != 0) {
    iVar1 = Gia_ObjFaninC0(pObj);
    local_12 = iVar1 != 0 ^ 0xff;
  }
  local_11 = local_12;
LAB_007a9dee:
  return (int)(local_11 & 1);
}

Assistant:

static inline int  Gia_ObjTerSimGet0Fanin0( Gia_Obj_t * pObj ) { return (Gia_ObjTerSimGet1(Gia_ObjFanin0(pObj)) && Gia_ObjFaninC0(pObj)) || (Gia_ObjTerSimGet0(Gia_ObjFanin0(pObj)) && !Gia_ObjFaninC0(pObj)); }